

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algorithms.cpp
# Opt level: O0

int __thiscall Algorithms::jacobiSymbol(Algorithms *this,BigInteger *a,BigInteger *P)

{
  bool bVar1;
  int iVar2;
  iterator __first;
  iterator __last;
  reference other;
  BigInteger local_120;
  BigInteger local_100;
  undefined1 local_e0 [8];
  BigInteger p;
  iterator __end1;
  iterator __begin1;
  vector<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_> *__range1;
  int ans;
  BigInteger local_90;
  undefined1 local_70 [8];
  vector<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_> fact;
  BigInteger local_48;
  BigInteger *local_28;
  BigInteger *P_local;
  BigInteger *a_local;
  Algorithms *this_local;
  
  local_28 = P;
  P_local = a;
  a_local = (BigInteger *)this;
  BigIntegerLibrary::BigInteger::BigInteger(&local_48,1);
  bVar1 = BigIntegerLibrary::BigInteger::operator==(P,&local_48);
  BigIntegerLibrary::BigInteger::~BigInteger(&local_48);
  if (bVar1) {
    this_local._4_4_ = 1;
  }
  else {
    BigIntegerLibrary::BigInteger::BigInteger(&local_90,P);
    factorization((vector<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>
                   *)local_70,this,&local_90);
    BigIntegerLibrary::BigInteger::~BigInteger(&local_90);
    __first = std::
              vector<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>
              ::begin((vector<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>
                       *)local_70);
    __last = std::
             vector<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>::
             end((vector<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>
                  *)local_70);
    std::
    sort<__gnu_cxx::__normal_iterator<BigIntegerLibrary::BigInteger*,std::vector<BigIntegerLibrary::BigInteger,std::allocator<BigIntegerLibrary::BigInteger>>>>
              ((__normal_iterator<BigIntegerLibrary::BigInteger_*,_std::vector<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>_>
                )__first._M_current,
               (__normal_iterator<BigIntegerLibrary::BigInteger_*,_std::vector<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>_>
                )__last._M_current);
    __range1._4_4_ = 1;
    __end1 = std::
             vector<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>::
             begin((vector<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>
                    *)local_70);
    p._24_8_ = std::
               vector<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>
               ::end((vector<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>
                      *)local_70);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<BigIntegerLibrary::BigInteger_*,_std::vector<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>_>
                                       *)&p.isNegative), bVar1) {
      other = __gnu_cxx::
              __normal_iterator<BigIntegerLibrary::BigInteger_*,_std::vector<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>_>
              ::operator*(&__end1);
      BigIntegerLibrary::BigInteger::BigInteger((BigInteger *)local_e0,other);
      BigIntegerLibrary::BigInteger::BigInteger(&local_100,a);
      BigIntegerLibrary::BigInteger::BigInteger(&local_120,(BigInteger *)local_e0);
      iVar2 = legendreSymbol(this,&local_100,&local_120);
      __range1._4_4_ = iVar2 * __range1._4_4_;
      BigIntegerLibrary::BigInteger::~BigInteger(&local_120);
      BigIntegerLibrary::BigInteger::~BigInteger(&local_100);
      if (__range1._4_4_ == 0) {
        this_local._4_4_ = 0;
      }
      BigIntegerLibrary::BigInteger::~BigInteger((BigInteger *)local_e0);
      if (__range1._4_4_ == 0) goto LAB_0010cc5a;
      __gnu_cxx::
      __normal_iterator<BigIntegerLibrary::BigInteger_*,_std::vector<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>_>
      ::operator++(&__end1);
    }
    this_local._4_4_ = __range1._4_4_;
LAB_0010cc5a:
    std::vector<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>::
    ~vector((vector<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_> *
            )local_70);
  }
  return this_local._4_4_;
}

Assistant:

int Algorithms::jacobiSymbol(BigInteger a, BigInteger P) {
    if (P == BigInteger(1)) {
        return 1;
    }
    auto fact = factorization(P);
    sort(fact.begin(), fact.end());
    int ans = 1;
    for (BigInteger p: fact) {
        ans *= legendreSymbol(a, p);
        if (ans == 0) {
            return 0;
        }
    }
    return ans;
}